

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

void __thiscall QTuioHandler::QTuioHandler(QTuioHandler *this,QString *specification)

{
  QLatin1StringView latin1;
  bool bVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  ushort uVar6;
  QFlags<QInputDevice::Capability> QVar7;
  uint uVar8;
  qsizetype qVar9;
  const_reference pQVar10;
  void *__src;
  QTransform *pQVar11;
  QPointingDevice *this_00;
  QObject *this_01;
  QFlags *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int argValue;
  int i;
  bool inverty;
  bool invertx;
  int rotationAngle;
  int portNumber;
  QString rotateArg;
  QString portString_1;
  QString portString;
  QStringList args;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 uVar12;
  SplitBehaviorFlags in_stack_fffffffffffffc2c;
  enum_type in_stack_fffffffffffffc30;
  undefined4 uVar13;
  enum_type in_stack_fffffffffffffc34;
  QString *in_stack_fffffffffffffc38;
  QString *t;
  QLatin1String *in_stack_fffffffffffffc40;
  QMessageLogger *this_02;
  QDebug *in_stack_fffffffffffffc48;
  QDebug *this_03;
  qsizetype in_stack_fffffffffffffc50;
  QString *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined6 in_stack_fffffffffffffc68;
  undefined2 in_stack_fffffffffffffc6e;
  const_reference in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc7c;
  Object *in_stack_fffffffffffffc80;
  QFlagsStorage<QString::SectionFlag> in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  QChar asep;
  const_reference in_stack_fffffffffffffca0;
  ConnectionType type;
  const_reference in_stack_fffffffffffffcc0;
  int local_2f8;
  int local_2f0;
  int local_2ec;
  Connection local_2c0 [64];
  QDebug local_280;
  socklen_t local_274;
  QMessageLogger *local_270;
  QString local_268;
  QFlagsStorageHelper<QInputDevice::Capability,_4> local_250;
  QFlagsStorageHelper<QInputDevice::Capability,_4> local_24c;
  undefined1 local_238 [30];
  QChar local_21a;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined1 local_1f8 [24];
  char *local_1e0;
  char *local_1d8;
  QDebug local_1b0;
  QChar local_1a2;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188 [30];
  QChar local_16a;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined1 local_150 [30];
  QChar local_132;
  QList<QString> local_130;
  undefined8 local_118;
  ulong local_110;
  undefined8 local_108;
  ulong local_100;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(in_RDI,(QObject *)0x0);
  *(undefined ***)in_RDI = &PTR_metaObject_00135820;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  QUdpSocket::QUdpSocket((QUdpSocket *)(in_RDI + 0x18),(QObject *)0x0);
  QMap<int,_QTuioCursor>::QMap((QMap<int,_QTuioCursor> *)0x10eca1);
  QList<QTuioCursor>::QList((QList<QTuioCursor> *)0x10ecb2);
  QMap<int,_QTuioToken>::QMap((QMap<int,_QTuioToken> *)0x10ecc3);
  QList<QTuioToken>::QList((QList<QTuioToken> *)0x10ecd4);
  QTransform::QTransform
            ((QTransform *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  local_130.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_130.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_130.d.size = -0x5555555555555556;
  QChar::QChar<char,_true>(&local_132,':');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),in_stack_fffffffffffffc2c
            );
  QString::split((QChar)(char16_t)&local_130,in_RSI,(uint)(ushort)local_132.ucs);
  local_2ec = 0xd05;
  local_2f0 = 0;
  bVar5 = false;
  bVar1 = false;
  local_2f8 = 0;
  while( true ) {
    type = (ConnectionType)in_stack_fffffffffffffcc0;
    qVar9 = QList<QString>::size(&local_130);
    if (qVar9 <= local_2f8) break;
    in_stack_fffffffffffffcc0 =
         QList<QString>::at((QList<QString> *)
                            CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                            CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    QString::QString(in_stack_fffffffffffffc38,
                     (char *)CONCAT26(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68));
    bVar3 = QString::startsWith((QString *)in_stack_fffffffffffffcc0,(CaseSensitivity)local_150);
    QString::~QString((QString *)0x10ee31);
    if ((bVar3 & 1) == 0) {
      pQVar10 = QList<QString>::at((QList<QString> *)
                                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      QString::QString(in_stack_fffffffffffffc38,
                       (char *)CONCAT26(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68));
      bVar3 = QString::startsWith((QString *)pQVar10,(CaseSensitivity)local_188);
      QString::~QString((QString *)0x10ef6b);
      if ((bVar3 & 1) == 0) {
        QList<QString>::at((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        local_1d8 = "invertx";
        bVar4 = operator==((QString *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                           (char **)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        if (bVar4) {
          bVar5 = true;
        }
        else {
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                             CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          local_1e0 = "inverty";
          bVar4 = operator==((QString *)
                             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                             (char **)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28))
          ;
          if (bVar4) {
            bVar1 = true;
          }
          else {
            pQVar10 = QList<QString>::at((QList<QString> *)
                                         CONCAT44(in_stack_fffffffffffffc34,
                                                  in_stack_fffffffffffffc30),
                                         CONCAT44(in_stack_fffffffffffffc2c,
                                                  in_stack_fffffffffffffc28));
            QString::QString(in_stack_fffffffffffffc38,
                             (char *)CONCAT26(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68));
            bVar3 = QString::startsWith((QString *)pQVar10,(CaseSensitivity)local_1f8);
            QString::~QString((QString *)0x10f1e2);
            asep.ucs = (char16_t)((uint)in_stack_fffffffffffffc8c >> 0x10);
            if ((bVar3 & 1) != 0) {
              local_218 = 0xaaaaaaaaaaaaaaaa;
              uStack_210 = 0xaaaaaaaaaaaaaaaa;
              local_208 = 0xaaaaaaaaaaaaaaaa;
              in_stack_fffffffffffffc70 =
                   QList<QString>::at((QList<QString> *)
                                      CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                                      CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28))
              ;
              QChar::QChar<char,_true>(&local_21a,'=');
              in_stack_fffffffffffffc7c = 0;
              QFlags<QString::SectionFlag>::QFlags
                        ((QFlags<QString::SectionFlag> *)
                         CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         in_stack_fffffffffffffc2c);
              in_stack_fffffffffffffc80 = (Object *)&local_218;
              QString::section(in_stack_fffffffffffffc58,asep,in_stack_fffffffffffffc50,
                               (qsizetype)in_stack_fffffffffffffc48,
                               (SectionFlags)in_stack_fffffffffffffc88.i);
              in_stack_fffffffffffffc8c =
                   QString::toInt(in_stack_fffffffffffffc38,
                                  (bool *)CONCAT44(in_stack_fffffffffffffc34,
                                                   in_stack_fffffffffffffc30),
                                  in_stack_fffffffffffffc2c);
              iVar2 = in_stack_fffffffffffffc8c;
              if (((in_stack_fffffffffffffc8c != 0x5a) &&
                  (iVar2 = in_stack_fffffffffffffc8c, in_stack_fffffffffffffc8c != 0xb4)) &&
                 (iVar2 = in_stack_fffffffffffffc8c, in_stack_fffffffffffffc8c != 0x10e)) {
                iVar2 = local_2f0;
              }
              local_2f0 = iVar2;
              QString::~QString((QString *)0x10f2e6);
            }
          }
        }
      }
      else {
        local_1a0 = 0xaaaaaaaaaaaaaaaa;
        local_198 = 0xaaaaaaaaaaaaaaaa;
        local_190 = 0xaaaaaaaaaaaaaaaa;
        in_stack_fffffffffffffca0 =
             QList<QString>::at((QList<QString> *)
                                CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                                CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        QChar::QChar<char,_true>(&local_1a2,'=');
        QFlags<QString::SectionFlag>::QFlags
                  ((QFlags<QString::SectionFlag> *)
                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   in_stack_fffffffffffffc2c);
        QString::section(in_stack_fffffffffffffc58,
                         (QChar)(char16_t)((uint)in_stack_fffffffffffffc8c >> 0x10),
                         in_stack_fffffffffffffc50,(qsizetype)in_stack_fffffffffffffc48,
                         (SectionFlags)in_stack_fffffffffffffc88.i);
        local_2ec = QString::toInt(in_stack_fffffffffffffc38,
                                   (bool *)CONCAT44(in_stack_fffffffffffffc34,
                                                    in_stack_fffffffffffffc30),
                                   in_stack_fffffffffffffc2c);
        local_108 = 0xaaaaaaaaaaaaaaaa;
        local_100 = 0xaaaaaaaaaaaaaaaa;
        lcTuioHandler();
        anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
                   CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)
                  );
        while (bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_108), bVar4) {
          anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x10f081);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,
                     in_stack_fffffffffffffc34,
                     (char *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                     (char *)0x10f09a);
          QMessageLogger::warning();
          QDebug::operator<<(in_stack_fffffffffffffc48,
                             (char *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30)
                             ,in_stack_fffffffffffffc2c);
          QDebug::~QDebug(&local_1b0);
          local_100 = local_100 & 0xffffffffffffff00;
        }
        QString::~QString((QString *)0x10f0f9);
      }
    }
    else {
      local_168 = 0xaaaaaaaaaaaaaaaa;
      local_160 = 0xaaaaaaaaaaaaaaaa;
      local_158 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
      QChar::QChar<char,_true>(&local_16a,'=');
      QFlags<QString::SectionFlag>::QFlags
                ((QFlags<QString::SectionFlag> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc2c);
      QString::section(in_stack_fffffffffffffc58,
                       (QChar)(char16_t)((uint)in_stack_fffffffffffffc8c >> 0x10),
                       in_stack_fffffffffffffc50,(qsizetype)in_stack_fffffffffffffc48,
                       (SectionFlags)in_stack_fffffffffffffc88.i);
      local_2ec = QString::toInt(in_stack_fffffffffffffc38,
                                 (bool *)CONCAT44(in_stack_fffffffffffffc34,
                                                  in_stack_fffffffffffffc30),
                                 in_stack_fffffffffffffc2c);
      QString::~QString((QString *)0x10ef07);
    }
    local_2f8 = local_2f8 + 1;
  }
  if (local_2f0 != 0) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::rotate((double)local_2f0,(Axis)local_58);
    __src = (void *)QTransform::translate(-0.5,-0.5);
    memcpy(in_RDI + 0x68,__src,0x4a);
  }
  if (bVar5) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::scale(-1.0,1.0);
    pQVar11 = (QTransform *)QTransform::translate(-0.5,-0.5);
    QTransform::operator*=((QTransform *)(in_RDI + 0x68),pQVar11);
  }
  if (bVar1) {
    QTransform::fromTranslate(0.5,0.5);
    QTransform::scale(1.0,-1.0);
    pQVar11 = (QTransform *)QTransform::translate(-0.5,-0.5);
    QTransform::operator*=((QTransform *)(in_RDI + 0x68),pQVar11);
  }
  this_00 = (QPointingDevice *)operator_new(0x10);
  QLatin1String::QLatin1String(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
  latin1.m_data._0_6_ = in_stack_fffffffffffffc68;
  latin1.m_size = in_stack_fffffffffffffc60;
  latin1.m_data._6_2_ = in_stack_fffffffffffffc6e;
  QString::QString((QString *)in_stack_fffffffffffffc40,latin1);
  local_250.super_QFlagsStorage<QInputDevice::Capability>.i =
       (QFlagsStorage<QInputDevice::Capability>)
       operator|(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
  local_24c.super_QFlagsStorage<QInputDevice::Capability>.i =
       (QFlagsStorage<QInputDevice::Capability>)
       QFlags<QInputDevice::Capability>::operator|
                 ((QFlags<QInputDevice::Capability> *)
                  CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc2c);
  QVar7 = QFlags<QInputDevice::Capability>::operator|
                    ((QFlags<QInputDevice::Capability> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc2c);
  QString::QString((QString *)0x10f4d0);
  local_270 = (QMessageLogger *)0xffffffffffffffff;
  t = &local_268;
  uVar12 = 0x10;
  uVar13 = 0;
  this_03 = (QDebug *)0x0;
  QPointingDevice::QPointingDevice
            (this_00,(QString *)local_238,1,TouchScreen,Finger,
             (QFlags *)
             (ulong)(uint)QVar7.super_QFlagsStorageHelper<QInputDevice::Capability,_4>.
                          super_QFlagsStorage<QInputDevice::Capability>.i,0x10,0,(QString *)t,
             (QPointingDeviceUniqueId)0xffffffffffffffff,(QObject *)0x0);
  *(QPointingDevice **)(in_RDI + 0x10) = this_00;
  QString::~QString((QString *)0x10f56b);
  QString::~QString((QString *)0x10f578);
  QWindowSystemInterface::registerInputDevice(*(QInputDevice **)(in_RDI + 0x10));
  this_01 = in_RDI + 0x18;
  uVar6 = (ushort)local_2ec;
  QFlags<QAbstractSocket::BindFlag>::QFlags
            ((QFlags<QAbstractSocket::BindFlag> *)CONCAT44(in_stack_fffffffffffffc34,uVar13),
             in_stack_fffffffffffffc2c);
  uVar8 = QUdpSocket::bind((QUdpSocket *)this_01,4,(sockaddr *)(ulong)uVar6,local_274);
  if ((uVar8 & 1) == 0) {
    local_118 = 0xaaaaaaaaaaaaaaaa;
    local_110 = 0xaaaaaaaaaaaaaaaa;
    lcTuioHandler();
    anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_fffffffffffffc34,uVar13),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffc2c,uVar12));
    this_02 = local_270;
    while (bVar5 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_118), bVar5) {
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x10f631);
      QMessageLogger::QMessageLogger
                (this_02,(char *)t,in_stack_fffffffffffffc34,
                 (char *)CONCAT44(in_stack_fffffffffffffc2c,uVar12),(char *)0x10f64a);
      QMessageLogger::warning();
      QDebug::operator<<(this_03,(char *)CONCAT44(in_stack_fffffffffffffc7c,
                                                  in_stack_fffffffffffffc78));
      QIODevice::errorString();
      QDebug::operator<<((QDebug *)this_02,t);
      QString::~QString((QString *)0x10f6b0);
      QDebug::~QDebug(&local_280);
      local_110 = local_110 & 0xffffffffffffff00;
    }
  }
  else {
    QObject::connect<void(QIODevice::*)(),void(QTuioHandler::*)()>
              (in_stack_fffffffffffffc80,(offset_in_QIODevice_to_subr)in_stack_fffffffffffffca0,
               (ContextType *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
               (offset_in_QTuioHandler_to_subr *)in_stack_fffffffffffffc70,type);
    QMetaObject::Connection::~Connection(local_2c0);
  }
  QList<QString>::~QList((QList<QString> *)0x10f772);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTuioHandler::QTuioHandler(const QString &specification)
{
    QStringList args = specification.split(':');
    int portNumber = 3333;
    int rotationAngle = 0;
    bool invertx = false;
    bool inverty = false;

    for (int i = 0; i < args.size(); ++i) {
        if (args.at(i).startsWith("udp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
        } else if (args.at(i).startsWith("tcp=")) {
            QString portString = args.at(i).section('=', 1, 1);
            portNumber = portString.toInt();
            qCWarning(lcTuioHandler) << "TCP is not yet supported. Falling back to UDP on " << portNumber;
        } else if (args.at(i) == "invertx") {
            invertx = true;
        } else if (args.at(i) == "inverty") {
            inverty = true;
        } else if (args.at(i).startsWith("rotate=")) {
            QString rotateArg = args.at(i).section('=', 1, 1);
            int argValue = rotateArg.toInt();
            switch (argValue) {
            case 90:
            case 180:
            case 270:
                rotationAngle = argValue;
                break;
            default:
                break;
            }
        }
    }

    if (rotationAngle)
        m_transform = QTransform::fromTranslate(0.5, 0.5).rotate(rotationAngle).translate(-0.5, -0.5);

    if (invertx)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(-1.0, 1.0).translate(-0.5, -0.5);

    if (inverty)
        m_transform *= QTransform::fromTranslate(0.5, 0.5).scale(1.0, -1.0).translate(-0.5, -0.5);

    // not leaked, QPointingDevice cleans up registered devices itself
    // TODO register each device based on SOURCE, not just an all-purpose generic touchscreen
    // TODO define seats when multiple connections occur
    m_device = new QPointingDevice(QLatin1String("TUIO"), 1, QInputDevice::DeviceType::TouchScreen,
                                   QPointingDevice::PointerType::Finger,
                                   QInputDevice::Capability::Position |
                                   QInputDevice::Capability::Area |
                                   QInputDevice::Capability::Velocity |
                                   QInputDevice::Capability::NormalizedPosition,
                                   16, 0);
    QWindowSystemInterface::registerInputDevice(m_device);

    if (!m_socket.bind(QHostAddress::Any, portNumber)) {
        qCWarning(lcTuioHandler) << "Failed to bind TUIO socket: " << m_socket.errorString();
        return;
    }

    connect(&m_socket, &QUdpSocket::readyRead, this, &QTuioHandler::processPackets);
}